

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * CTcPrsOpUnary::parse_neg(CTcPrsNode *subexpr)

{
  size_t __n;
  int iVar1;
  undefined4 extraout_var;
  CTcConstVal *this;
  CTcPrsNode *pCVar2;
  undefined4 extraout_var_01;
  char *pcVar3;
  size_t in_RSI;
  char *pcVar4;
  size_t siz;
  vbignum_t b;
  undefined4 extraout_var_00;
  
  iVar1 = (*(subexpr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    pCVar2 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x10,in_RSI);
    pCVar2[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)subexpr;
    (pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_003509b8;
  }
  else {
    iVar1 = (*(subexpr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(subexpr);
    this = (CTcConstVal *)CONCAT44(extraout_var_00,iVar1);
    pCVar2 = subexpr;
    if (this->typ_ == TC_CVT_INT) {
      if ((this->val_).intval_ < -0x7fffffff) {
        vbignum_t::vbignum_t(&b,0x80000000);
        CTcConstVal::set_float(this,&b,1);
        vbignum_t::~vbignum_t(&b);
      }
      else {
        this->typ_ = TC_CVT_INT;
        (this->val_).intval_ = -(this->val_).intval_;
      }
    }
    else {
      iVar1 = (*(subexpr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(subexpr);
      if (*(int *)CONCAT44(extraout_var_01,iVar1) == 0xd) {
        pcVar3 = (this->val_).floatval_.txt_;
        __n = (this->val_).floatval_.len_;
        if ((__n == 0) || (*pcVar3 != '-')) {
          siz = __n + 1;
          pcVar4 = (char *)CTcPrsMem::alloc(G_prsmem,siz);
          *pcVar4 = '-';
          memcpy(pcVar4 + 1,pcVar3,__n);
        }
        else {
          pcVar4 = pcVar3 + 1;
          siz = __n - 1;
        }
        this->typ_ = TC_CVT_FLOAT;
        (this->val_).floatval_.txt_ = pcVar4;
        (this->val_).floatval_.len_ = siz;
        CTcConstVal::demote_float(this);
      }
      else {
        pcVar3 = CTcTokenizer::get_op_text(TOKT_MINUS);
        CTcTokenizer::log_error(0x2b01,pcVar3);
      }
    }
  }
  return pCVar2;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_neg(CTcPrsNode *subexpr)
{
    /* 
     *   if the underlying expression is a constant value, apply the
     *   operator 
     */
    if (subexpr->is_const())
    {
        /* we need an integer or float */
        CTcConstVal *cval = subexpr->get_const_val();
        if (cval->get_type() == TC_CVT_INT)
        {
            /* 
             *   Negating an integer.  There's a special overflow case to
             *   check for: if we're negating INT32MINVAL, the result doesn't
             *   fit in a signed integer, so we need to promote it to float. 
             */
            long l = cval->get_val_int();
            if (l <= INT32MINVAL)
            {
                /* overflow - promote to BigNumber */
                vbignum_t b((ulong)2147483648U);
                cval->set_float(&b, TRUE);
            }
            else
            {
                /* set the value negative in the subexpression */
                cval->set_int(-l);
            }
        }
        else if (subexpr->get_const_val()->get_type() == TC_CVT_FLOAT)
        {
            /* get the original value */
            const char *ctxt = cval->get_val_float();
            size_t clen = cval->get_val_float_len();

            /* if the old value is negative, simply remove the sign */
            if (clen > 0 && ctxt[0] == '-')
            {
                /* keep the old value, removing the sign */
                cval->set_float(ctxt + 1, clen - 1, cval->is_promoted());
            }
            else
            {
                /* allocate new buffer for the float text plus a '-' */
                char *new_txt = (char *)G_prsmem->alloc(clen + 1);

                /* insert the minus sign */
                new_txt[0] = '-';

                /* add the original string */
                memcpy(new_txt + 1, ctxt, clen);

                /* update the subexpression's constant value to the new text */
                cval->set_float(new_txt, clen + 1, cval->is_promoted());
            }

            /* check for possible demotion back to int */
            cval->demote_float();
        }
        else
        {
            /* log the error */
            G_tok->log_error(TCERR_CONST_UNARY_REQ_NUM,
                             G_tok->get_op_text(TOKT_MINUS));
        }

        /* return the modified constant value */
        return subexpr;
    }

    /* create the unary negation node */
    return new CTPNNeg(subexpr);
}